

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void BoostLexicalCastOnStack<unsigned_short>(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  char *pcVar3;
  unsigned_short *extraout_RDX;
  unsigned_short *arg;
  unsigned_short *extraout_RDX_00;
  rep rVar4;
  undefined1 local_6a [8];
  buf_t buf;
  unsigned_short i;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  unsigned_short _imax;
  unsigned_short _imin;
  ResultType _result;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  pcVar3 = std::type_info::name((type_info *)&unsigned_short::typeinfo);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"boost::lexical_cast on stack");
  poVar2 = std::operator<<(poVar2,"... ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)(buf._M_elems + 0x3a),
             (duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffff0);
  buf._M_elems[0x38] = '\0';
  buf._M_elems[0x39] = '\0';
  arg = extraout_RDX;
  for (; buf._M_elems._56_2_ != -1; buf._M_elems._56_2_ = buf._M_elems._56_2_ + 1) {
    boost::lexical_cast<std::array<char,64ul>,unsigned_short>
              ((array<char,_64UL> *)local_6a,(boost *)(buf._M_elems + 0x38),arg);
    arg = extraout_RDX_00;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)(buf._M_elems + 0x3a))
  ;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffff0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BoostLexicalCastOnStack()
{
    typedef std::array<char, 64> buf_t;
    PROFILING_BEGIN(T, "boost::lexical_cast on stack")
    buf_t buf = boost::lexical_cast<buf_t>(i);
    PROFILING_END()
}